

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O2

void __thiscall QScrollBar::QScrollBar(QScrollBar *this,Orientation orientation,QWidget *parent)

{
  QScrollBarPrivate *this_00;
  QScrollBarPrivate *this_01;
  
  this_01 = (QScrollBarPrivate *)operator_new(0x2c0);
  QScrollBarPrivate::QScrollBarPrivate(this_01);
  QAbstractSlider::QAbstractSlider
            (&this->super_QAbstractSlider,(QAbstractSliderPrivate *)this_01,parent);
  *(undefined ***)&(this->super_QAbstractSlider).super_QWidget = &PTR_metaObject_007d3168;
  *(undefined ***)&(this->super_QAbstractSlider).super_QWidget.super_QPaintDevice =
       &PTR__QScrollBar_007d3328;
  this_00 = *(QScrollBarPrivate **)&(this->super_QAbstractSlider).super_QWidget.field_0x8;
  (this_00->super_QAbstractSliderPrivate).orientation = orientation;
  QScrollBarPrivate::init(this_00,(EVP_PKEY_CTX *)this_01);
  return;
}

Assistant:

QScrollBar::QScrollBar(Qt::Orientation orientation, QWidget *parent)
    : QAbstractSlider(*new QScrollBarPrivate, parent)
{
    d_func()->orientation = orientation;
    d_func()->init();
}